

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void anon_unknown.dwarf_c7dac::StateTestBPMUINT(BinaryPolynomialModel<unsigned_int,_double> *bpm)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  double *pdVar2;
  double dVar3;
  bool bVar4;
  const_iterator __begin1;
  double *pdVar5;
  const_iterator cVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *it;
  pointer pvVar7;
  int iVar8;
  pointer *__ptr_1;
  AssertHelperData *pAVar9;
  long lVar10;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var11;
  char *pcVar12;
  char *in_R9;
  pointer *__ptr;
  __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  _Var13;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<unsigned_int> __l_08;
  initializer_list<unsigned_int> __l_09;
  initializer_list<unsigned_int> __l_10;
  initializer_list<unsigned_int> __l_11;
  initializer_list<unsigned_int> __l_12;
  initializer_list<unsigned_int> __l_13;
  initializer_list<unsigned_int> __l_14;
  initializer_list<unsigned_int> __l_15;
  initializer_list<unsigned_int> __l_16;
  initializer_list<unsigned_int> __l_17;
  initializer_list<unsigned_int> __l_18;
  initializer_list<unsigned_int> __l_19;
  initializer_list<unsigned_int> __l_20;
  initializer_list<unsigned_int> __l_21;
  initializer_list<unsigned_int> __l_22;
  initializer_list<unsigned_int> __l_23;
  initializer_list<unsigned_int> __l_24;
  initializer_list<unsigned_int> __l_25;
  initializer_list<unsigned_int> __l_26;
  initializer_list<unsigned_int> __l_27;
  initializer_list<unsigned_int> __l_28;
  initializer_list<unsigned_int> __l_29;
  initializer_list<unsigned_int> __l_30;
  initializer_list<unsigned_int> __l_31;
  initializer_list<unsigned_int> __l_32;
  initializer_list<unsigned_int> __l_33;
  initializer_list<unsigned_int> __l_34;
  initializer_list<unsigned_int> __l_35;
  initializer_list<unsigned_int> __l_36;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sorted_variables;
  AssertHelper local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_80;
  pointer local_78;
  AssertHelper local_70;
  undefined1 local_68 [8];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_58;
  allocator_type local_39;
  uint local_38 [2];
  
  local_88 = (undefined1  [8])(bpm->variables_)._M_h._M_element_count;
  local_98.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_68,"bpm.GetNumVariables()","4",(unsigned_long *)local_88,
             (int *)&local_98);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0xf3,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetOffset(bpm);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_68,"bpm.GetOffset()","0.0",dVar3,0.0);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0xf5,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  local_88 = (undefined1  [8])
             (((long)(bpm->poly_key_list_).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(bpm->poly_key_list_).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_98.data_._0_4_ = 0xf;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_68,"bpm.GetNumInteractions()","15",(unsigned_long *)local_88,
             (int *)&local_98);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0xf7,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  local_88 = (undefined1  [8])0x0;
  for (pvVar7 = (bpm->poly_key_list_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar7 != (bpm->poly_key_list_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pvVar7 = pvVar7 + 1) {
    _Var11._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )((long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2);
    if ((ulong)local_88 <=
        (ulong)_Var11._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl) {
      local_88 = (undefined1  [8])
                 _Var11._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
    }
  }
  local_98.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_68,"bpm.GetDegree()","4",(unsigned_long *)local_88,(int *)&local_98);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0xf9,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  local_98.data_._0_4_ = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({1} )","1.0",dVar3,1.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0xfc,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_._0_4_ = 2;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_00,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({2} )","2.0",dVar3,2.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0xfd,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_._0_4_ = 3;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_01,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({3} )","3.0",dVar3,3.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0xfe,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_._0_4_ = 4;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_02,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({4} )","4.0",dVar3,4.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0xff,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)&DAT_200000001;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_03,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({1, 2} )","12.0",dVar3,12.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x100,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0x300000001;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_04,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({1, 3} )","13.0",dVar3,13.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x101,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0x400000001;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_05,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({1, 4} )","14.0",dVar3,14.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x102,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0x300000002;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_06,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({2, 3} )","23.0",dVar3,23.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x103,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0x400000002;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_07,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({2, 4} )","24.0",dVar3,24.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x104,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)&DAT_400000003;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_08,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({3, 4} )","34.0",dVar3,34.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x105,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)&DAT_200000001;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,3);
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_09,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({1, 2, 3} )","123.0",dVar3,123.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x106,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)&DAT_200000001;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,4);
  __l_10._M_len = 3;
  __l_10._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_10,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({1, 2, 4} )","124.0",dVar3,124.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x107,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0x300000001;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,4);
  __l_11._M_len = 3;
  __l_11._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_11,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({1, 3, 4} )","134.0",dVar3,134.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x108,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0x300000002;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,4);
  __l_12._M_len = 3;
  __l_12._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_12,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({2, 3, 4} )","234.0",dVar3,234.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x109,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)&DAT_200000001;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_400000003;
  __l_13._M_len = 4;
  __l_13._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_13,
             (allocator_type *)&local_70);
  dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({1, 2, 3, 4})","1234.0",dVar3,1234.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x10a,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  if (bpm->vartype_ == BINARY) {
    local_98.data_ = (AssertHelperData *)&DAT_100000001;
    pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_100000001
    ;
    __l_15._M_len = 4;
    __l_15._M_array = (iterator)&local_98;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_15,
               (allocator_type *)&local_70);
    dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                      (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_88,"bpm.GetPolynomial({1, 1, 1, 1} )","1.0",dVar3,1.0);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
    }
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = (pbStack_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x114,pcVar12);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_68 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(size_type *)local_68 + 8))();
      }
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
    local_88 = (undefined1  [8])&DAT_100000001;
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_200000001
    ;
    local_78 = (pointer)CONCAT44(local_78._4_4_,2);
    __l_17._M_len = 5;
    __l_17._M_array = (iterator)local_88;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_17,
               (allocator_type *)&local_70);
    dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                      (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&local_98,"bpm.GetPolynomial({1, 1, 1, 2, 2} )","12.0",dVar3,12.0);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
    }
    if (local_98.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = (pbStack_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x115,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_68 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(size_type *)local_68 + 8))();
      }
    }
    if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_90,pbStack_90);
    }
    local_88 = (undefined1  [8])0x300000001;
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300000003;
    local_78 = (pointer)CONCAT44(local_78._4_4_,1);
    __l_19._M_len = 5;
    __l_19._M_array = (iterator)local_88;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_19,
               (allocator_type *)&local_70);
    dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                      (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&local_98,"bpm.GetPolynomial({1, 3, 3, 3, 1} )","13.0",dVar3,13.0);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
    }
    if (local_98.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = (pbStack_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x116,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_68 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(size_type *)local_68 + 8))();
      }
    }
    if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_90,pbStack_90);
    }
    aStack_58._M_allocated_capacity._0_4_ = 3;
    aStack_58._M_allocated_capacity._4_4_ = 2;
    aStack_58._8_4_ = 2;
    local_68 = (undefined1  [8])0x200000003;
    uStack_60 = 3;
    uStack_5c = 2;
    __l_21._M_len = 7;
    __l_21._M_array = (iterator)local_68;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,__l_21,
               (allocator_type *)&local_70);
    dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                      (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&local_98,"bpm.GetPolynomial({3, 2, 3, 2, 3, 2, 2})","23.0",dVar3,23.0);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_88 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      operator_delete((void *)local_88,(long)local_78 - (long)local_88);
    }
    if (local_98.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = (pbStack_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x117,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_68);
LAB_0011aded:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_68 + 8))();
      }
    }
LAB_0011ae07:
    if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_90,pbStack_90);
    }
  }
  else if (bpm->vartype_ == SPIN) {
    local_98.data_ = (AssertHelperData *)&DAT_100000001;
    pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(pbStack_90._4_4_,1);
    __l_14._M_len = 3;
    __l_14._M_array = (iterator)&local_98;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_14,
               (allocator_type *)&local_70);
    dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                      (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_88,"bpm.GetPolynomial({1, 1, 1} )","1.0",dVar3,1.0);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
    }
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = (pbStack_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x10e,pcVar12);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_68 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(size_type *)local_68 + 8))();
      }
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
    local_98.data_ = (AssertHelperData *)&DAT_100000001;
    pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_200000001
    ;
    __l_16._M_len = 4;
    __l_16._M_array = (iterator)&local_98;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_16,
               (allocator_type *)&local_70);
    dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                      (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_88,"bpm.GetPolynomial({1, 1, 1, 2} )","12.0",dVar3,12.0);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
    }
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = (pbStack_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x10f,pcVar12);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_68 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(size_type *)local_68 + 8))();
      }
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
    local_98.data_ = (AssertHelperData *)0x300000001;
    pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300000003;
    __l_18._M_len = 4;
    __l_18._M_array = (iterator)&local_98;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_18,
               (allocator_type *)&local_70);
    dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                      (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_88,"bpm.GetPolynomial({1, 3, 3, 3} )","13.0",dVar3,13.0);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
    }
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = (pbStack_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x110,pcVar12);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_68 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(size_type *)local_68 + 8))();
      }
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
    local_88 = (undefined1  [8])0x200000003;
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200000003;
    local_78 = (pointer)0x200000003;
    __l_20._M_len = 6;
    __l_20._M_array = (iterator)local_88;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_20,
               (allocator_type *)&local_70);
    dVar3 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                      (bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&local_98,"bpm.GetPolynomial({3, 2, 3, 2, 3, 2})","23.0",dVar3,23.0);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
    }
    if (local_98.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = (pbStack_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x111,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_68);
      goto LAB_0011aded;
    }
    goto LAB_0011ae07;
  }
  local_98.data_._0_4_ = 1;
  local_88 = (undefined1  [8])
             cimod::BinaryPolynomialModel<unsigned_int,_double>::GetVariablesToIntegers
                       (bpm,(uint *)&local_98);
  local_70.data_ = (AssertHelperData *)((ulong)local_70.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_68,"bpm.GetVariablesToIntegers(1)","0",(long *)local_88,
             (int *)&local_70);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x11b,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  local_98.data_._0_4_ = 2;
  local_88 = (undefined1  [8])
             cimod::BinaryPolynomialModel<unsigned_int,_double>::GetVariablesToIntegers
                       (bpm,(uint *)&local_98);
  local_70.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_68,"bpm.GetVariablesToIntegers(2)","1",(long *)local_88,
             (int *)&local_70);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x11c,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  local_98.data_._0_4_ = 3;
  local_88 = (undefined1  [8])
             cimod::BinaryPolynomialModel<unsigned_int,_double>::GetVariablesToIntegers
                       (bpm,(uint *)&local_98);
  local_70.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_68,"bpm.GetVariablesToIntegers(3)","2",(long *)local_88,
             (int *)&local_70);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x11d,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  local_98.data_._0_4_ = 4;
  local_88 = (undefined1  [8])
             cimod::BinaryPolynomialModel<unsigned_int,_double>::GetVariablesToIntegers
                       (bpm,(uint *)&local_98);
  local_70.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_68,"bpm.GetVariablesToIntegers(4)","3",(long *)local_88,
             (int *)&local_70);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x11e,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 1;
  __l_22._M_len = 1;
  __l_22._M_array = local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_22,&local_39);
  pAVar9 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var13._M_current != pvVar1; _Var13._M_current = _Var13._M_current + 1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
            operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                        *)&local_98,_Var13);
    pAVar9 = (AssertHelperData *)((long)&pAVar9->type + (ulong)bVar4);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x121,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 2;
  __l_23._M_len = 1;
  __l_23._M_array = local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_23,&local_39);
  pAVar9 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var13._M_current != pvVar1; _Var13._M_current = _Var13._M_current + 1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
            operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                        *)&local_98,_Var13);
    pAVar9 = (AssertHelperData *)((long)&pAVar9->type + (ulong)bVar4);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{2} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x122,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 3;
  __l_24._M_len = 1;
  __l_24._M_array = local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_24,&local_39);
  pAVar9 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var13._M_current != pvVar1; _Var13._M_current = _Var13._M_current + 1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
            operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                        *)&local_98,_Var13);
    pAVar9 = (AssertHelperData *)((long)&pAVar9->type + (ulong)bVar4);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{3} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x123,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 4;
  __l_25._M_len = 1;
  __l_25._M_array = local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_25,&local_39);
  pAVar9 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var13._M_current != pvVar1; _Var13._M_current = _Var13._M_current + 1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
            operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                        *)&local_98,_Var13);
    pAVar9 = (AssertHelperData *)((long)&pAVar9->type + (ulong)bVar4);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{4} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x124,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = (uint  [2])&DAT_200000001;
  __l_26._M_len = 2;
  __l_26._M_array = local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_26,&local_39);
  pAVar9 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var13._M_current != pvVar1; _Var13._M_current = _Var13._M_current + 1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
            operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                        *)&local_98,_Var13);
    pAVar9 = (AssertHelperData *)((long)&pAVar9->type + (ulong)bVar4);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1, 2} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x125,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 1;
  local_38[1] = 3;
  __l_27._M_len = 2;
  __l_27._M_array = local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_27,&local_39);
  pAVar9 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var13._M_current != pvVar1; _Var13._M_current = _Var13._M_current + 1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
            operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                        *)&local_98,_Var13);
    pAVar9 = (AssertHelperData *)((long)&pAVar9->type + (ulong)bVar4);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1, 3} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x126,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 1;
  local_38[1] = 4;
  __l_28._M_len = 2;
  __l_28._M_array = local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_28,&local_39);
  pAVar9 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var13._M_current != pvVar1; _Var13._M_current = _Var13._M_current + 1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
            operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                        *)&local_98,_Var13);
    pAVar9 = (AssertHelperData *)((long)&pAVar9->type + (ulong)bVar4);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1, 4} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x127,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 2;
  local_38[1] = 3;
  __l_29._M_len = 2;
  __l_29._M_array = local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_29,&local_39);
  pAVar9 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var13._M_current != pvVar1; _Var13._M_current = _Var13._M_current + 1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
            operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                        *)&local_98,_Var13);
    pAVar9 = (AssertHelperData *)((long)&pAVar9->type + (ulong)bVar4);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{2, 3} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x128,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 2;
  local_38[1] = 4;
  __l_30._M_len = 2;
  __l_30._M_array = local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_30,&local_39);
  pAVar9 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var13._M_current != pvVar1; _Var13._M_current = _Var13._M_current + 1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
            operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                        *)&local_98,_Var13);
    pAVar9 = (AssertHelperData *)((long)&pAVar9->type + (ulong)bVar4);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{2, 4} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x129,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = (uint  [2])&DAT_400000003;
  __l_31._M_len = 2;
  __l_31._M_array = local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_31,&local_39);
  pAVar9 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var13._M_current != pvVar1; _Var13._M_current = _Var13._M_current + 1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
            operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                        *)&local_98,_Var13);
    pAVar9 = (AssertHelperData *)((long)&pAVar9->type + (ulong)bVar4);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{3, 4} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x12a,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_98.data_ = (AssertHelperData *)&DAT_200000001;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,3);
  __l_32._M_len = 3;
  __l_32._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_32,&local_39);
  lVar10 = 0;
  local_70.data_ = (AssertHelperData *)local_68;
  if (_Var13._M_current != pvVar7) {
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
              operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                          *)&local_70,_Var13);
      lVar10 = lVar10 + (ulong)bVar4;
      _Var13._M_current = _Var13._M_current + 1;
    } while (_Var13._M_current != pvVar7);
  }
  local_70.data_._0_4_ = 1;
  local_38 = (uint  [2])lVar10;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1, 2, 3} )"
             ,"1",(long *)local_38,(int *)&local_70);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_68 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               299,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_98.data_ = (AssertHelperData *)&DAT_200000001;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,4);
  __l_33._M_len = 3;
  __l_33._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_33,&local_39);
  lVar10 = 0;
  local_70.data_ = (AssertHelperData *)local_68;
  if (_Var13._M_current != pvVar7) {
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
              operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                          *)&local_70,_Var13);
      lVar10 = lVar10 + (ulong)bVar4;
      _Var13._M_current = _Var13._M_current + 1;
    } while (_Var13._M_current != pvVar7);
  }
  local_70.data_._0_4_ = 1;
  local_38 = (uint  [2])lVar10;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1, 2, 4} )"
             ,"1",(long *)local_38,(int *)&local_70);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               300,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_98.data_ = (AssertHelperData *)0x300000001;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,4);
  __l_34._M_len = 3;
  __l_34._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_34,&local_39);
  lVar10 = 0;
  local_70.data_ = (AssertHelperData *)local_68;
  if (_Var13._M_current != pvVar7) {
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
              operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                          *)&local_70,_Var13);
      lVar10 = lVar10 + (ulong)bVar4;
      _Var13._M_current = _Var13._M_current + 1;
    } while (_Var13._M_current != pvVar7);
  }
  local_70.data_._0_4_ = 1;
  local_38 = (uint  [2])lVar10;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1, 3, 4} )"
             ,"1",(long *)local_38,(int *)&local_70);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_68 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x12d,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_98.data_ = (AssertHelperData *)0x300000002;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,4);
  __l_35._M_len = 3;
  __l_35._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_35,&local_39);
  lVar10 = 0;
  local_70.data_ = (AssertHelperData *)local_68;
  if (_Var13._M_current != pvVar7) {
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
              operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                          *)&local_70,_Var13);
      lVar10 = lVar10 + (ulong)bVar4;
      _Var13._M_current = _Var13._M_current + 1;
    } while (_Var13._M_current != pvVar7);
  }
  local_70.data_._0_4_ = 1;
  local_38 = (uint  [2])lVar10;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{2, 3, 4} )"
             ,"1",(long *)local_38,(int *)&local_70);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x12e,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var13._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_98.data_ = (AssertHelperData *)&DAT_200000001;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_400000003;
  __l_36._M_len = 4;
  __l_36._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,__l_36,&local_39);
  lVar10 = 0;
  local_70.data_ = (AssertHelperData *)local_68;
  if (_Var13._M_current != pvVar7) {
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
              operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                          *)&local_70,_Var13);
      lVar10 = lVar10 + (ulong)bVar4;
      _Var13._M_current = _Var13._M_current + 1;
    } while (_Var13._M_current != pvVar7);
  }
  local_70.data_._0_4_ = 1;
  local_38 = (uint  [2])lVar10;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1, 2, 3, 4})"
             ,"1",(long *)local_38,(int *)&local_70);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_68 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x12f,pcVar12);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0011c1db:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(1.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x132,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -1.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    if (!(bool)local_88[0]) goto LAB_0011c1db;
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0011c2f6:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(2.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x133,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -2.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    if (!(bool)local_88[0]) goto LAB_0011c2f6;
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0011c411:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(3.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x134,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -3.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    if (!(bool)local_88[0]) goto LAB_0011c411;
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0011c52c:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(4.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x135,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -4.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    if (!(bool)local_88[0]) goto LAB_0011c52c;
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0011c647:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(12.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x136,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -12.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    if (!(bool)local_88[0]) goto LAB_0011c647;
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0011c762:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(13.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x137,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -13.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    if (!(bool)local_88[0]) goto LAB_0011c762;
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0011c87d:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(14.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x138,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -14.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    if (!(bool)local_88[0]) goto LAB_0011c87d;
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0011c998:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(23.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x139,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -23.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    if (!(bool)local_88[0]) goto LAB_0011c998;
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0011cab3:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(24.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x13a,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -24.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    if (!(bool)local_88[0]) goto LAB_0011cab3;
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0011cbce:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(34.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x13b,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -34.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    if (!(bool)local_88[0]) goto LAB_0011cbce;
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0011cce9:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(123.0 , bpm.GetValueList())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x13c,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -123.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    if (!(bool)local_88[0]) goto LAB_0011cce9;
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0011ce04:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(124.0 , bpm.GetValueList())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x13d,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -124.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    if (!(bool)local_88[0]) goto LAB_0011ce04;
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0011cf1f:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(134.0 , bpm.GetValueList())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x13e,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -134.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    if (!(bool)local_88[0]) goto LAB_0011cf1f;
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0011d03a:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(234.0 , bpm.GetValueList())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x13f,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -234.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    if (!(bool)local_88[0]) goto LAB_0011d03a;
  }
  pdVar5 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 == pdVar2) {
    local_88 = (undefined1  [8])((ulong)(uint7)local_88._1_7_ << 8);
  }
  else {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(ABS(*pdVar5 + -1234.0) < 1e-15);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
    local_88[0] = (internal)(iVar8 != 0);
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar8 != 0) goto LAB_0011d1f4;
  }
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::Message::Message((Message *)&local_98);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_68,(internal *)local_88,
             (AssertionResult *)"EXPECT_CONTAIN(1234.0, bpm.GetValueList())","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
             0x140,(char *)local_68);
  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_68 != (undefined1  [8])&aStack_58) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) + 1);
  }
  if (local_98.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_98.data_ + 8))();
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
LAB_0011d1f4:
  cimod::BinaryPolynomialModel<unsigned_int,_double>::GetSortedVariables
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,bpm);
  local_98.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_88,"sorted_variables[0]","1",(uint *)local_68,(int *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x144,pcVar12);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_88,"sorted_variables[1]","2",(uint *)((long)local_68 + 4),
             (int *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x145,pcVar12);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_88,"sorted_variables[2]","3",(uint *)((long)local_68 + 8),
             (int *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x146,pcVar12);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_88,"sorted_variables[3]","4",(uint *)((long)local_68 + 0xc),
             (int *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x147,pcVar12);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_70.data_._0_4_ = 1;
  cVar6 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)bpm,(key_type *)&local_70);
  local_98.data_ =
       (AssertHelperData *)
       (ulong)(cVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0);
  local_38[0] = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_88,"bpm.GetVariables().count(1)","1",(unsigned_long *)&local_98,
             (int *)local_38);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x14a,pcVar12);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_70.data_._0_4_ = 2;
  cVar6 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)bpm,(key_type *)&local_70);
  local_98.data_ =
       (AssertHelperData *)
       (ulong)(cVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0);
  local_38[0] = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_88,"bpm.GetVariables().count(2)","1",(unsigned_long *)&local_98,
             (int *)local_38);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x14b,pcVar12);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_70.data_._0_4_ = 3;
  cVar6 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)bpm,(key_type *)&local_70);
  local_98.data_ =
       (AssertHelperData *)
       (ulong)(cVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0);
  local_38[0] = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_88,"bpm.GetVariables().count(3)","1",(unsigned_long *)&local_98,
             (int *)local_38);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x14c,pcVar12);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_70.data_._0_4_ = 4;
  cVar6 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)bpm,(key_type *)&local_70);
  local_98.data_ =
       (AssertHelperData *)
       (ulong)(cVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0);
  local_38[0] = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_88,"bpm.GetVariables().count(4)","1",(unsigned_long *)&local_98,
             (int *)local_38);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x14d,pcVar12);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_68 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  return;
}

Assistant:

void StateTestBPMUINT(const BinaryPolynomialModel<uint32_t, double> &bpm) {
   
   EXPECT_EQ(bpm.GetNumVariables(), 4);

   EXPECT_DOUBLE_EQ(bpm.GetOffset(), 0.0);
   
   EXPECT_EQ(bpm.GetNumInteractions(), 15);
   
   EXPECT_EQ(bpm.GetDegree(), 4);
      
   //Polynomial
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1}         ), 1.0   );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({2}         ), 2.0   );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({3}         ), 3.0   );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({4}         ), 4.0   );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 2}      ), 12.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 3}      ), 13.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 4}      ), 14.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({2, 3}      ), 23.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({2, 4}      ), 24.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({3, 4}      ), 34.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 2, 3}   ), 123.0 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 2, 4}   ), 124.0 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 3, 4}   ), 134.0 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({2, 3, 4}   ), 234.0 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 2, 3, 4}), 1234.0);
   
   //Polynomial duplicate key
   if (bpm.GetVartype() == cimod::Vartype::SPIN) {
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 1, 1}         ), 1.0 );
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 1, 1, 2}      ), 12.0);
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 3, 3, 3}      ), 13.0);
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({3, 2, 3, 2, 3, 2}), 23.0);
   }
   else if (bpm.GetVartype() == cimod::Vartype::BINARY) {
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 1, 1, 1}         ), 1.0 );
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 1, 1, 2, 2}      ), 12.0);
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 3, 3, 3, 1}      ), 13.0);
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({3, 2, 3, 2, 3, 2, 2}), 23.0);
   }
   
   //variables_to_integers
   EXPECT_EQ(bpm.GetVariablesToIntegers(1), 0);
   EXPECT_EQ(bpm.GetVariablesToIntegers(2), 1);
   EXPECT_EQ(bpm.GetVariablesToIntegers(3), 2);
   EXPECT_EQ(bpm.GetVariablesToIntegers(4), 3);

   //Polynomial Key
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1}         ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{2}         ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{3}         ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{4}         ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1, 2}      ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1, 3}      ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1, 4}      ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{2, 3}      ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{2, 4}      ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{3, 4}      ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1, 2, 3}   ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1, 2, 4}   ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1, 3, 4}   ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{2, 3, 4}   ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{1, 2, 3, 4}), 1);

   //Polynomial Val
   EXPECT_TRUE(EXPECT_CONTAIN(1.0   , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(2.0   , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(3.0   , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(4.0   , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(12.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(13.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(14.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(23.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(24.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(34.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(123.0 , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(124.0 , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(134.0 , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(234.0 , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(1234.0, bpm.GetValueList()));

   //sorted_variables
   auto sorted_variables = bpm.GetSortedVariables();
   EXPECT_EQ(sorted_variables[0], 1);
   EXPECT_EQ(sorted_variables[1], 2);
   EXPECT_EQ(sorted_variables[2], 3);
   EXPECT_EQ(sorted_variables[3], 4);
   
   //variables
   EXPECT_EQ(bpm.GetVariables().count(1), 1);
   EXPECT_EQ(bpm.GetVariables().count(2), 1);
   EXPECT_EQ(bpm.GetVariables().count(3), 1);
   EXPECT_EQ(bpm.GetVariables().count(4), 1);
}